

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O0

void __thiscall rengine::SDLBackend::processEvents(SDLBackend *this)

{
  int iVar1;
  int local_4c;
  undefined1 local_48 [4];
  int evt;
  SDL_Event event;
  SDLBackend *this_local;
  
  event._48_8_ = this;
  local_4c = SDL_PollEvent(0);
  while (iVar1 = local_4c + -1, 0 < local_4c) {
    SDL_PollEvent(local_48);
    local_4c = iVar1;
    if (local_48 == (undefined1  [4])0x100) {
      (this->super_Backend).m_running = false;
    }
    else if (local_48 == (undefined1  [4])0x400) {
      sendPointerEvent(this,(SDL_Event *)local_48,PointerMove);
    }
    else if (local_48 == (undefined1  [4])0x401) {
      sendPointerEvent(this,(SDL_Event *)local_48,PointerDown);
    }
    else if (local_48 == (undefined1  [4])0x402) {
      sendPointerEvent(this,(SDL_Event *)local_48,PointerUp);
    }
    else if (local_48 == (undefined1  [4])0x8000) {
      this->m_renderRequested = false;
      (*this->m_surface->_vptr_Surface[2])();
    }
  }
  return;
}

Assistant:

inline void SDLBackend::processEvents()
{
    SDL_Event event;
    int evt = SDL_PollEvent(nullptr);

    // This odd-looking construct ensures we do not process events that are
    // pushed onto the queue after we start processing, so as to not starve the
    // main loop.
    while (evt-- > 0) {
        SDL_PollEvent(&event);

        switch (event.type) {
            case SDL_USEREVENT: {
                // reset this before onRender so we don't prevent onRender from
                // scheduling another one..
                m_renderRequested = false;
                m_surface->onRender();
                break;
            }
            case SDL_MOUSEBUTTONDOWN: {
                sendPointerEvent(&event, Event::PointerDown);
                break;
            }
            case SDL_MOUSEBUTTONUP: {
                sendPointerEvent(&event, Event::PointerUp);
                break;
            }
            case SDL_MOUSEMOTION: {
                sendPointerEvent(&event, Event::PointerMove);
                break;
            }
            case SDL_QUIT: {
                m_running = false;
                break;
            }
            default: {
                // logw << "unknown event.type " << event.type << std::endl;
            }
        }
    }
}